

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O2

usize Unicode::length(char ch)

{
  undefined8 uStack_8;
  
  if (ch < '\0') {
    if ((ch & 0xe0U) == 0xc0) {
      uStack_8 = 2;
    }
    else {
      if ((ch & 0xf0U) != 0xe0) {
        return (ulong)((ch & 0xf8U) == 0xf0) << 2;
      }
      uStack_8 = 3;
    }
  }
  else {
    uStack_8 = 1;
  }
  return uStack_8;
}

Assistant:

static usize length(char ch)
  {
    if((ch & 0x80) == 0)
      return 1;
    if((ch & 0xe0) == 0xc0)
      return 2;
    if((ch & 0xf0) == 0xe0)
      return 3;
    if((ch & 0xf8) == 0xf0)
      return 4;
    return 0;
  }